

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

int __thiscall glcts::LayoutBindingBaseCase::init(LayoutBindingBaseCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *color;
  Texture2DMap *this_00;
  Texture3DMap *this_01;
  Texture2DArrayMap *this_02;
  uint uVar1;
  Texture3D *this_03;
  Texture2DArray *this_04;
  int iVar2;
  undefined4 extraout_var;
  mapped_type this_05;
  undefined4 extraout_var_00;
  iterator iVar3;
  mapped_type *ppTVar4;
  undefined4 extraout_var_01;
  iterator iVar5;
  mapped_type *ppTVar6;
  undefined4 extraout_var_02;
  iterator iVar7;
  mapped_type *ppTVar8;
  LayoutBindingSubTest (*data) [14];
  _Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  local_1f0;
  LayoutBindingSubTest tests [14];
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
  this->m_drawTest = (ulong)(iVar2 == 2) * 8 + 0x129;
  *(undefined8 *)&this->field_0x88 = 0;
  memcpy(tests,&PTR_anon_var_dwarf_6fca9a_01de4670,0x1c0);
  makeVector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,14ul>
            ((vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
              *)&local_1f0,(glcts *)tests,data);
  std::
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::_M_move_assign(&this->m_tests,&local_1f0);
  std::
  _Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::~_Vector_base(&local_1f0);
  this->m_uniformDeclTemplate =
       "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_INSTANCE_NAME}${UNIFORM_ARRAY};\n"
  ;
  color = &this->m_expectedColor;
  (this->m_expectedColor).m_data[0] = 0.0;
  (this->m_expectedColor).m_data[1] = 1.0;
  (this->m_expectedColor).m_data[2] = 0.0;
  (this->m_expectedColor).m_data[3] = 1.0;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0xc);
  ppTVar4 = (mapped_type *)(ulong)uVar1;
  if (uVar1 == 5) {
    this_05 = (mapped_type)operator_new(0x70);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)this_05,*(RenderContext **)(CONCAT44(extraout_var_02,iVar2) + 8),
               0x8058,2,2,1);
    tcu::Texture2DArray::allocLevel((Texture2DArray *)&this_05->m_isCompressed,0);
    tcu::clear((PixelBufferAccess *)
               (this_05->m_refTexture).super_TextureLevelPyramid.m_data.
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,color);
    glu::Texture2DArray::upload((Texture2DArray *)this_05);
    this_02 = &this->m_textures2DArray;
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    iVar7 = std::
            _Rb_tree<int,_std::pair<const_int,_glu::Texture2DArray_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2DArray_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
            ::find(&this_02->_M_t,(key_type_conflict *)&local_1f0);
    if ((_Rb_tree_header *)iVar7._M_node !=
        &(this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header) {
      local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      ppTVar8 = std::
                map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
                ::operator[](this_02,(key_type_conflict *)&local_1f0);
      this_04 = *ppTVar8;
      if (this_04 != (Texture2DArray *)0x0) {
        glu::Texture2DArray::~Texture2DArray(this_04);
      }
      operator_delete(this_04,0x70);
    }
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    ppTVar4 = (mapped_type *)
              std::
              map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
              ::operator[](this_02,(key_type_conflict *)&local_1f0);
  }
  else if (uVar1 == 3) {
    this_05 = (mapped_type)operator_new(0x70);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::Texture3D::Texture3D
              ((Texture3D *)this_05,*(RenderContext **)(CONCAT44(extraout_var_01,iVar2) + 8),0x8058,
               2,2,1);
    tcu::Texture3D::allocLevel((Texture3D *)&this_05->m_isCompressed,0);
    tcu::clear((PixelBufferAccess *)
               (this_05->m_refTexture).super_TextureLevelPyramid.m_data.
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,color);
    glu::Texture3D::upload((Texture3D *)this_05);
    this_01 = &this->m_textures3D;
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    iVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_glu::Texture3D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture3D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
            ::find(&this_01->_M_t,(key_type_conflict *)&local_1f0);
    if ((_Rb_tree_header *)iVar5._M_node != &(this->m_textures3D)._M_t._M_impl.super__Rb_tree_header
       ) {
      local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      ppTVar6 = std::
                map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
                ::operator[](this_01,(key_type_conflict *)&local_1f0);
      this_03 = *ppTVar6;
      if (this_03 != (Texture3D *)0x0) {
        glu::Texture3D::~Texture3D(this_03);
      }
      operator_delete(this_03,0x70);
    }
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    ppTVar4 = (mapped_type *)
              std::
              map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
              ::operator[](this_01,(key_type_conflict *)&local_1f0);
  }
  else {
    if (uVar1 != 2) goto LAB_00beb2bc;
    this_05 = (mapped_type)operator_new(0x70);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::ImmutableTexture2D::ImmutableTexture2D
              ((ImmutableTexture2D *)this_05,
               *(RenderContext **)(CONCAT44(extraout_var_00,iVar2) + 8),0x8058,2,2);
    tcu::Texture2D::allocLevel(&this_05->m_refTexture,0);
    tcu::clear((this_05->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,color);
    (*((Texture2D *)&this_05->_vptr_Texture2D)->_vptr_Texture2D[2])(this_05);
    this_00 = &this->m_textures2D;
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_glu::Texture2D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
            ::find(&this_00->_M_t,(key_type_conflict *)&local_1f0);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_textures2D)._M_t._M_impl.super__Rb_tree_header
       ) {
      local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      ppTVar4 = std::
                map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
                ::operator[](this_00,(key_type_conflict *)&local_1f0);
      if (*ppTVar4 != (mapped_type)0x0) {
        (*(*ppTVar4)->_vptr_Texture2D[1])();
      }
    }
    local_1f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    ppTVar4 = std::
              map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
              ::operator[](this_00,(key_type_conflict *)&local_1f0);
  }
  *ppTVar4 = this_05;
LAB_00beb2bc:
  return (int)ppTVar4;
}

Assistant:

void init(void)
	{
		m_drawTest =
			(getStage() == ComputeShader) ? &LayoutBindingBaseCase::drawTestCompute : &LayoutBindingBaseCase::drawTest;

#define MAKE_TEST_ENTRY(__subtest_name__) { #__subtest_name__, "", &LayoutBindingBaseCase::__subtest_name__ }
		LayoutBindingSubTest tests[] = {
			MAKE_TEST_ENTRY(binding_basic_default),		 MAKE_TEST_ENTRY(binding_basic_explicit),
			MAKE_TEST_ENTRY(binding_basic_multiple),	 MAKE_TEST_ENTRY(binding_basic_render),
			MAKE_TEST_ENTRY(binding_integer_constant),   MAKE_TEST_ENTRY(binding_integer_constant_expression),
			MAKE_TEST_ENTRY(binding_array_size),		 MAKE_TEST_ENTRY(binding_array_implicit),
			MAKE_TEST_ENTRY(binding_array_multiple),	 MAKE_TEST_ENTRY(binding_api_update),
			MAKE_TEST_ENTRY(binding_compilation_errors), MAKE_TEST_ENTRY(binding_link_errors),
			MAKE_TEST_ENTRY(binding_examples),			 MAKE_TEST_ENTRY(binding_mixed_order)
		};
		m_tests = makeVector(tests);

		m_uniformDeclTemplate = "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_"
								"INSTANCE_NAME}${UNIFORM_ARRAY};\n";

		m_expectedColor = tcu::Vec4(0.0, 1.0f, 0.0f, 1.0f);

		switch (getTestParameters().texture_type)
		{
		case TwoD:
		{
			// 2D
			glu::ImmutableTexture2D* texture2D =
				new glu::ImmutableTexture2D(getContext().getRenderContext(), GL_RGBA8, 2, 2);

			texture2D->getRefTexture().allocLevel(0);
			tcu::clear(texture2D->getRefTexture().getLevel(0), m_expectedColor);
			texture2D->upload();

			if (m_textures2D.find(0) != m_textures2D.end())
			{
				delete m_textures2D[0];
			}

			m_textures2D[0] = texture2D;
		}
		break;
		case TwoDArray:
		{
			// 2DArray
			glu::Texture2DArray* texture2DArray =
				new glu::Texture2DArray(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture2DArray->getRefTexture().allocLevel(0);
			tcu::clear(texture2DArray->getRefTexture().getLevel(0), m_expectedColor);
			texture2DArray->upload();

			if (m_textures2DArray.find(0) != m_textures2DArray.end())
			{
				delete m_textures2DArray[0];
			}

			m_textures2DArray[0] = texture2DArray;
		}
		break;
		// 3D
		case ThreeD:
		{
			glu::Texture3D* texture3D = new glu::Texture3D(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture3D->getRefTexture().allocLevel(0);
			tcu::clear(texture3D->getRefTexture().getLevel(0), m_expectedColor);
			texture3D->upload();

			if (m_textures3D.find(0) != m_textures3D.end())
			{
				delete m_textures3D[0];
			}

			m_textures3D[0] = texture3D;
		}
		break;
		case None:
			// test case where no texture allocation is needed
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}